

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Template * __thiscall
inja::Environment::parse_template
          (Template *__return_storage_ptr__,Environment *this,string *filename)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string_view local_e0;
  undefined1 local_d0 [8];
  Parser parser;
  string *filename_local;
  Environment *this_local;
  
  parser.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  pIVar1 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  pIVar2 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  pIVar3 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  Parser::Parser((Parser *)local_d0,&pIVar1->parser_config,&pIVar2->lexer_config,
                 &pIVar3->included_templates);
  pIVar1 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  std::__cxx11::string::string
            ((string *)&local_120,
             (string *)
             parser.m_loop_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator+(&local_100,&pIVar1->input_path,&local_120);
  nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
  basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_e0,&local_100);
  Parser::parse_template(__return_storage_ptr__,(Parser *)local_d0,local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  Parser::~Parser((Parser *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Template parse_template(const std::string& filename) {
		Parser parser(m_impl->parser_config, m_impl->lexer_config, m_impl->included_templates);
		return parser.parse_template(m_impl->input_path + static_cast<std::string>(filename));
	}